

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countdown_latch_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::CountdownLatchTest_TestCountdownLatchThreadLockCountdownNotFinished_Test::
CountdownLatchTest_TestCountdownLatchThreadLockCountdownNotFinished_Test
          (CountdownLatchTest_TestCountdownLatchThreadLockCountdownNotFinished_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00272738;
  return;
}

Assistant:

TEST(CountdownLatchTest, TestCountdownLatchThreadLockCountdownNotFinished)
{
    std::shared_ptr<CountdownLatch> latch = std::make_unique<CountdownLatch>(3);
    std::chrono::time_point<std::chrono::system_clock> start = std::chrono::system_clock::now();
    std::thread thread(SleepThenCountdownLatch, latch, std::chrono::seconds(1), 2);
    std::chrono::time_point<std::chrono::system_clock> end = std::chrono::system_clock::now();
    bool result = latch->Await(std::chrono::seconds(4));
    EXPECT_FALSE(result);
    EXPECT_EQ(1, latch->GetCount());
    EXPECT_GT(std::chrono::seconds(4), end.time_since_epoch() - start.time_since_epoch());
    thread.join();
}